

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_ptr.hpp
# Opt level: O2

qsbr_ptr<const_std::byte> * __thiscall
unodb::qsbr_ptr<const_std::byte>::operator=
          (qsbr_ptr<const_std::byte> *this,qsbr_ptr<const_std::byte> *other)

{
  pointer pbVar1;
  
  detail::qsbr_ptr_base::unregister_active_ptr(this->ptr);
  pbVar1 = other->ptr;
  other->ptr = (pointer)0x0;
  this->ptr = pbVar1;
  return this;
}

Assistant:

UNODB_DETAIL_RELEASE_CONSTEXPR qsbr_ptr &operator=(
      qsbr_ptr &&other) noexcept {
#ifndef NDEBUG
    unregister_active_ptr(ptr);
#endif
    ptr = std::exchange(other.ptr, nullptr);
    return *this;
  }